

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O1

void __thiscall
OpenMD::RadialDistrFunc::RadialDistrFunc
          (RadialDistrFunc *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          uint nbins)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  SelectionManager *this_02;
  SelectionManager *this_03;
  SelectionManager *this_04;
  pointer pcVar1;
  int iVar2;
  long lVar3;
  SelectionManager local_118;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_48;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__RadialDistrFunc_0033b0d0;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar1,pcVar1 + sele1->_M_string_length);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  pcVar1 = (sele2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript2_,pcVar1,pcVar1 + sele2->_M_string_length);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this_02 = &this->seleMan1_;
  SelectionManager::SelectionManager(this_02,info);
  this_03 = &this->seleMan2_;
  SelectionManager::SelectionManager(this_03,info);
  SelectionManager::SelectionManager(&this->sele1_minus_common_,info);
  SelectionManager::SelectionManager(&this->sele2_minus_common_,info);
  this_04 = &this->common_;
  SelectionManager::SelectionManager(this_04,info);
  SelectionEvaluator::loadScriptString(this_00,sele1);
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_118,this_00);
    lVar3 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar3),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_118.info_)->_vptr_SimInfo + lVar3));
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_118);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xb])(this,this_02);
  }
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_118,this_01);
    lVar3 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar3),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_118.info_)->_vptr_SimInfo + lVar3));
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_118);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xc])(this,this_03);
  }
  if (((this->evaluator1_).isDynamic_ == false) && ((this->evaluator2_).isDynamic_ == false)) {
    operator&(&local_118,this_02,this_03);
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (this->common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (this->common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->common_).info_ = local_118.info_;
    (this->common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_48);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(this->common_).nObjects_,&local_118.nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::_M_move_assign
              (&(this->common_).stuntdoubles_,&local_118.stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::_M_move_assign
              (&(this->common_).bonds_,&local_118.bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::_M_move_assign
              (&(this->common_).bends_,&local_118.bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::_M_move_assign
              (&(this->common_).torsions_,&local_118.torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::_M_move_assign
              (&(this->common_).inversions_,&local_118.inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::_M_move_assign
              (&(this->common_).molecules_,&local_118.molecules_);
    SelectionManager::~SelectionManager(&local_118);
    operator-(&local_118,this_02,this_04);
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->sele1_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (this->sele1_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (this->sele1_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).info_ = local_118.info_;
    (this->sele1_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_48);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(this->sele1_minus_common_).nObjects_,&local_118.nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::_M_move_assign
              (&(this->sele1_minus_common_).stuntdoubles_,&local_118.stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::_M_move_assign
              (&(this->sele1_minus_common_).bonds_,&local_118.bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::_M_move_assign
              (&(this->sele1_minus_common_).bends_,&local_118.bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::_M_move_assign
              (&(this->sele1_minus_common_).torsions_,&local_118.torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::_M_move_assign
              (&(this->sele1_minus_common_).inversions_,&local_118.inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::_M_move_assign
              (&(this->sele1_minus_common_).molecules_,&local_118.molecules_);
    SelectionManager::~SelectionManager(&local_118);
    operator-(&local_118,this_03,this_04);
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->sele2_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (this->sele2_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (this->sele2_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).info_ = local_118.info_;
    (this->sele2_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_48);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(this->sele2_minus_common_).nObjects_,&local_118.nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::_M_move_assign
              (&(this->sele2_minus_common_).stuntdoubles_,&local_118.stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::_M_move_assign
              (&(this->sele2_minus_common_).bonds_,&local_118.bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::_M_move_assign
              (&(this->sele2_minus_common_).bends_,&local_118.bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::_M_move_assign
              (&(this->sele2_minus_common_).torsions_,&local_118.torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::_M_move_assign
              (&(this->sele2_minus_common_).inversions_,&local_118.inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::_M_move_assign
              (&(this->sele2_minus_common_).molecules_,&local_118.molecules_);
    SelectionManager::~SelectionManager(&local_118);
    iVar2 = OpenMDBitSet::countBits
                      ((this->seleMan1_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    this->nSelected1_ = iVar2;
    iVar2 = OpenMDBitSet::countBits
                      ((this->seleMan2_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    this->nSelected2_ = iVar2;
    iVar2 = OpenMDBitSet::countBits
                      ((this->common_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    this->nPairs_ = this->nSelected2_ * this->nSelected1_ - ((iVar2 + 1) * iVar2) / 2;
  }
  return;
}

Assistant:

RadialDistrFunc::RadialDistrFunc(SimInfo* info, const std::string& filename,
                                   const std::string& sele1,
                                   const std::string& sele2,
                                   unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript1_(sele1), selectionScript2_(sele2), evaluator1_(info),
      evaluator2_(info), seleMan1_(info), seleMan2_(info),
      sele1_minus_common_(info), sele2_minus_common_(info), common_(info) {
    evaluator1_.loadScriptString(sele1);
    evaluator2_.loadScriptString(sele2);

    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      validateSelection1(seleMan1_);
    }
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      validateSelection2(seleMan2_);
    }

    if (!evaluator1_.isDynamic() && !evaluator2_.isDynamic()) {
      // If all selections are static, we can precompute the number
      // of real pairs.
      common_             = seleMan1_ & seleMan2_;
      sele1_minus_common_ = seleMan1_ - common_;
      sele2_minus_common_ = seleMan2_ - common_;

      nSelected1_    = seleMan1_.getSelectionCount();
      nSelected2_    = seleMan2_.getSelectionCount();
      int nIntersect = common_.getSelectionCount();

      nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
    }
  }